

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::IRContext::ProcessEntryPointCallTree(IRContext *this,ProcessFunction *pfn)

{
  Module *pMVar1;
  Instruction *this_00;
  bool bVar2;
  Instruction *e;
  Instruction **ppIVar3;
  uint32_t local_8c;
  ProcessFunction *local_88;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  
  local_88 = pfn;
  std::queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  queue<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>(&roots);
  pMVar1 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar3 = (Instruction **)
            ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (this_00 = *ppIVar3,
        this_00 !=
        (Instruction *)
        ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    local_8c = Instruction::GetSingleWordInOperand(this_00,1);
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&roots.c,&local_8c);
    ppIVar3 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  bVar2 = ProcessCallTreeFromRoots(this,local_88,&roots);
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
            ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&roots);
  return bVar2;
}

Assistant:

bool IRContext::ProcessEntryPointCallTree(ProcessFunction& pfn) {
  // Collect all of the entry points as the roots.
  std::queue<uint32_t> roots;
  for (auto& e : module()->entry_points()) {
    roots.push(e.GetSingleWordInOperand(kEntryPointFunctionIdInIdx));
  }
  return ProcessCallTreeFromRoots(pfn, &roots);
}